

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecpp.cpp
# Opt level: O3

int non_whitespace(QString *content,int pos)

{
  long lVar1;
  long lVar2;
  int i;
  ulong uVar3;
  
  lVar1 = (content->d).size;
  lVar2 = (long)pos;
  if (lVar2 < lVar1) {
    do {
      uVar3 = (ulong)(ushort)(content->d).ptr[lVar2];
      if ((0x20 < uVar3) || ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0)) {
        return (int)lVar2;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < lVar1);
  }
  return -1;
}

Assistant:

int non_whitespace(const QString& content, int pos) {
    for(int i=pos;i<content.size();i++) {
        bool ws = content[i] == ' '
                || content[i] == '\t'
                || content[i] == '\r'
                || content[i] == '\n';
        if (!ws) {
            return i;
        }
    }
    return -1;
}